

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::TaskSet::Task::~Task(Task *this)

{
  Task *this_local;
  
  Own<kj::_::PromiseNode>::~Own(&this->node);
  Maybe<kj::Own<kj::TaskSet::Task>_>::~Maybe(&this->next);
  _::Event::~Event(&this->super_Event);
  return;
}

Assistant:

Task(TaskSet& taskSet, Own<_::PromiseNode>&& nodeParam)
      : taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }